

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void factor(Vm *vm)

{
  TokenType TVar1;
  OP_CODE OStack_10;
  
  TVar1 = (vm->compiler).token.type;
  if (TVar1 == TOKEN_MINUS) {
    advance(vm);
    power(vm);
    OStack_10 = OP_NEGATE;
  }
  else {
    if (TVar1 != TOKEN_BANG) {
      power(vm);
      return;
    }
    advance(vm);
    power(vm);
    OStack_10 = OP_NOT;
  }
  emit_no_arg(vm,OStack_10);
  return;
}

Assistant:

static void factor(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_BANG:
            advance(vm);
            power(vm);
            emit_no_arg(vm, OP_NOT);
            break;
        case TOKEN_MINUS:
            advance(vm);
            power(vm);
            emit_no_arg(vm, OP_NEGATE);
            break;
        default:
            power(vm);
            break;
    }
}